

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::Remove(FString *this,size_t index,size_t remlen)

{
  char *pcVar1;
  size_t sVar2;
  FStringData *pFVar3;
  char *pcVar4;
  size_t local_48;
  FStringData *old;
  size_t remlen_local;
  size_t index_local;
  FString *this_local;
  
  sVar2 = Len(this);
  if (index < sVar2) {
    sVar2 = Len(this);
    if (index + remlen < sVar2) {
      sVar2 = Len(this);
      local_48 = remlen;
      if (sVar2 - remlen < remlen) {
        local_48 = Len(this);
        local_48 = local_48 - remlen;
      }
      pFVar3 = Data(this);
      if (pFVar3->RefCount == 1) {
        pcVar1 = this->Chars;
        pcVar4 = this->Chars;
        sVar2 = Len(this);
        memmove(pcVar1 + index,pcVar4 + local_48 + index,(sVar2 - index) - local_48);
        pcVar1 = this->Chars;
        sVar2 = Len(this);
        memset(pcVar1 + (sVar2 - local_48),0,local_48);
        pFVar3 = Data(this);
        pFVar3->Len = pFVar3->Len - (int)local_48;
      }
      else {
        pFVar3 = Data(this);
        AllocBuffer(this,pFVar3->Len - local_48);
        pcVar1 = this->Chars;
        pcVar4 = FStringData::Chars(pFVar3);
        StrCopy(pcVar1,pcVar4,index);
        pcVar1 = this->Chars;
        pcVar4 = FStringData::Chars(pFVar3);
        StrCopy(pcVar1 + index,pcVar4 + local_48 + index,(pFVar3->Len - index) - local_48);
        FStringData::Release(pFVar3);
      }
    }
    else {
      Truncate(this,index);
    }
  }
  return;
}

Assistant:

void FString::Remove(size_t index, size_t remlen)
{
	if (index < Len())
	{
		if (index + remlen >= Len())
		{
			Truncate((long)index);
		}
		else
		{
			remlen = Len() - remlen < remlen ? Len() - remlen : remlen;
			if (Data()->RefCount == 1)
			{ // Can do this in place
				memmove(Chars + index, Chars + index + remlen, Len() - index - remlen);
				memset(Chars + Len() - remlen, 0, remlen);
				Data()->Len -= (unsigned)remlen;
			}
			else
			{ // Must do it in a copy
				FStringData *old = Data();
				AllocBuffer(old->Len - remlen);
				StrCopy(Chars, old->Chars(), index);
				StrCopy(Chars + index, old->Chars() + index + remlen, old->Len - index - remlen);
				old->Release();
			}
		}
	}
}